

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_counter.cc
# Opt level: O1

bool __thiscall absl::lts_20240722::BlockingCounter::DecrementCount(BlockingCounter *this)

{
  atomic<int> *paVar1;
  int iVar2;
  undefined1 extraout_AL;
  undefined7 extraout_var;
  MutexLock l;
  
  LOCK();
  paVar1 = &this->count_;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (0 < iVar2) {
    if (iVar2 == 1) {
      Mutex::Lock(&this->lock_);
      this->done_ = true;
      Mutex::Unlock(&this->lock_);
    }
    return iVar2 == 1;
  }
  DecrementCount();
  __clang_call_terminate(CONCAT71(extraout_var,extraout_AL));
}

Assistant:

bool BlockingCounter::DecrementCount() {
  int count = count_.fetch_sub(1, std::memory_order_acq_rel) - 1;
  ABSL_RAW_CHECK(count >= 0,
                 "BlockingCounter::DecrementCount() called too many times");
  if (count == 0) {
    MutexLock l(&lock_);
    done_ = true;
    return true;
  }
  return false;
}